

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O0

void readheader(void)

{
  int iVar1;
  undefined1 local_88 [8];
  char card [81];
  char cStack_2f;
  char cStack_2e;
  char filename [13];
  int jj;
  int ii;
  int hdutype;
  int keypos;
  int nkeys;
  int status;
  fitsfile *fptr;
  
  builtin_strncpy(card + 0x4b,"atestf",6);
  cStack_2f = 'i';
  cStack_2e = 'l';
  keypos = 0;
  iVar1 = ffopentest(10,&nkeys,card + 0x4b,0,&keypos);
  if (iVar1 != 0) {
    printerror(keypos);
  }
  filename[9] = '\x01';
  filename[10] = '\0';
  filename[0xb] = '\0';
  filename[0xc] = '\0';
  while( true ) {
    iVar1 = ffmahd(_nkeys,filename._9_4_,&jj,&keypos);
    if (iVar1 != 0) break;
    iVar1 = ffghps(_nkeys,&hdutype,&ii,&keypos);
    if (iVar1 != 0) {
      printerror(keypos);
    }
    printf("Header listing for HDU #%d:\n",(ulong)(uint)filename._9_4_);
    filename[5] = '\x01';
    filename[6] = '\0';
    filename[7] = '\0';
    filename[8] = '\0';
    for (; (int)filename._5_4_ <= hdutype; filename._5_4_ = filename._5_4_ + 1) {
      iVar1 = ffgrec(_nkeys,filename._5_4_,local_88,&keypos);
      if (iVar1 != 0) {
        printerror(keypos);
      }
      printf("%s\n",local_88);
    }
    printf("END\n\n");
    filename._9_4_ = filename._9_4_ + 1;
  }
  if (keypos == 0x6b) {
    keypos = 0;
  }
  else {
    printerror(keypos);
  }
  iVar1 = ffclos(_nkeys,&keypos);
  if (iVar1 != 0) {
    printerror(keypos);
  }
  return;
}

Assistant:

void readheader ( void )

    /**********************************************************************/
    /* Print out all the header keywords in all extensions of a FITS file */
    /**********************************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */

    int status, nkeys, keypos, hdutype, ii, jj;
    char filename[]  = "atestfil.fit";     /* name of existing FITS file   */
    char card[FLEN_CARD];   /* standard string lengths defined in fitsioc.h */

    status = 0;

    if ( fits_open_file(&fptr, filename, READONLY, &status) ) 
         printerror( status );

    /* attempt to move to next HDU, until we get an EOF error */
    for (ii = 1; !(fits_movabs_hdu(fptr, ii, &hdutype, &status) ); ii++) 
    {
        /* get no. of keywords */
        if (fits_get_hdrpos(fptr, &nkeys, &keypos, &status) )
            printerror( status );

        printf("Header listing for HDU #%d:\n", ii);
        for (jj = 1; jj <= nkeys; jj++)  {
            if ( fits_read_record(fptr, jj, card, &status) )
                 printerror( status );

            printf("%s\n", card); /* print the keyword card */
        }
        printf("END\n\n");  /* terminate listing with END */
    }

    if (status == END_OF_FILE)   /* status values are defined in fitsioc.h */
        status = 0;              /* got the expected EOF error; reset = 0  */
    else
       printerror( status );     /* got an unexpected error                */

    if ( fits_close_file(fptr, &status) )
         printerror( status );

    return;
}